

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::Params::reset(Params *this)

{
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = 6;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  QChar::QChar<char16_t,_true>(&local_a,L' ');
  *(char16_t *)(in_RDI + 3) = local_a.ucs;
  in_RDI[4] = 1;
  in_RDI[5] = 0;
  QFlags<QTextStream::NumberFlag>::QFlags((QFlags<QTextStream::NumberFlag> *)0x13de66);
  in_RDI[6] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::Params::reset()
{
    realNumberPrecision = 6;
    integerBase = 0;
    fieldWidth = 0;
    padChar = u' ';
    fieldAlignment = QTextStream::AlignRight;
    realNumberNotation = QTextStream::SmartNotation;
    numberFlags = { };
}